

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O1

void __thiscall cfdcapi_key_ExtkeyTest_Test::TestBody(cfdcapi_key_ExtkeyTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *version;
  char *fingerprint;
  char *get_extkey;
  AssertHelper local_c0;
  int ret;
  AssertionResult gtest_ar;
  undefined1 local_a0 [16];
  AssertHelper local_90;
  void *handle;
  char *privkey;
  char *chain_code;
  char *extprivkey3;
  uint32_t depth;
  char *pubkey;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  char *wif;
  uint32_t child_number;
  char *extprivkey2;
  char *key_path_data;
  char *extpubkey1;
  char *extprivkey4;
  char *extprivkey1;
  int key_type;
  int net_type;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  pubkey = (char *)((ulong)pubkey._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&pubkey,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pubkey);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&privkey,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&privkey,(Message *)&pubkey);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&privkey);
    if (pubkey != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (pubkey != (char *)0x0)) {
        (**(code **)(*(long *)pubkey + 8))();
      }
      pubkey = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  pubkey = (char *)CONCAT71(pubkey._1_7_,handle != (void *)0x0);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&privkey);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&pubkey,(AssertionResult *)"(NULL == handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&wif,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x240,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&wif,(Message *)&privkey);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wif);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a0) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (privkey != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (privkey != (char *)0x0)) {
        (**(code **)(*(long *)privkey + 8))();
      }
      privkey = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pubkey = (char *)0x0;
  privkey = (char *)0x0;
  wif = (char *)0x0;
  extprivkey1 = (char *)0x0;
  extprivkey2 = (char *)0x0;
  extprivkey3 = (char *)0x0;
  extprivkey4 = (char *)0x0;
  extpubkey1 = (char *)0x0;
  key_path_data = (char *)0x0;
  ret = CfdCreateExtkeyFromSeed
                  (handle,
                   "0e09fbdd00e575b654d480ae979f24da45ef4dee645c7dc2e3b30b2e093d38dda0202357754cc856f8920b8e31dd02e9d34f6a2b20dc825c6ba90f90009085e1"
                   ,0,0,&extprivkey1);
  version = (char *)((ulong)version._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&version);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fingerprint,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x250,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
    if (version != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (version != (char *)0x0)) {
        (**(code **)(*(long *)version + 8))();
      }
      version = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx\""
               ,"extprivkey1",
               "xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx"
               ,extprivkey1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x252,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdCreateExtkeyFromParent(handle,extprivkey1,0x2c,true,0,0,&extprivkey2);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x256,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3\""
               ,"extprivkey2",
               "xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3"
               ,extprivkey2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x259,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdCreateExtPubkey(handle,extprivkey2,0,&extpubkey1);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x25d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2\""
               ,"extpubkey1",
               "xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2"
               ,extpubkey1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x260,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdCreateExtkeyFromParentPath(handle,extprivkey2,"0h/0h/2",0,0,&extprivkey3);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x264,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ\""
               ,"extprivkey3",
               "xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ"
               ,extprivkey3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x267,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetPrivkeyFromExtkey(handle,extprivkey3,0,&privkey,&wif);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472\"","privkey",
               "597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472",privkey);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2\"",
               "wif","KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2",wif);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x26f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetPubkeyFromExtkey(handle,extprivkey3,0,&pubkey);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x273,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,
               "\"031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1\"","pubkey",
               "031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1",pubkey);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x276,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdGetParentExtkeyPathData(handle,extprivkey2,"0h/0h/2",0,&key_path_data,&extprivkey4);
    version = (char *)((ulong)version & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"[03af54a0/0h/0h/2]\"","key_path_data","[03af54a0/0h/0h/2]",
               key_path_data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"extprivkey3","extprivkey4",extprivkey3,extprivkey4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&version);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fingerprint,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x27e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
      if (version != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (version != (char *)0x0)) {
          (**(code **)(*(long *)version + 8))();
        }
        version = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    version = (char *)0x0;
    fingerprint = (char *)0x0;
    chain_code = (char *)0x0;
    depth = 0;
    child_number = 0;
    ret = CfdGetExtkeyInformation
                    (handle,extprivkey3,&version,&fingerprint,&chain_code,&depth,&child_number);
    get_extkey = (char *)((ulong)get_extkey._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&get_extkey,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&get_extkey);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x287,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (get_extkey != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (get_extkey != (char *)0x0)) {
          (**(code **)(*(long *)get_extkey + 8))();
        }
        get_extkey = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"\"0488ade4\"","version","0488ade4",version);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x289,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"\"8806118d\"","fingerprint","8806118d",fingerprint);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292\"","chain_code"
                 ,"a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292",chain_code);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      get_extkey = (char *)CONCAT44(get_extkey._4_4_,4);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"4","depth",(int *)&get_extkey,&depth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      get_extkey = (char *)CONCAT44(get_extkey._4_4_,2);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"2","child_number",(int *)&get_extkey,&child_number);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x28d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      net_type = 0;
      key_type = 0;
      ret = CfdGetExtkeyInfo(handle,extprivkey3,(char **)0x0,(char **)0x0,(char **)0x0,&depth,
                             &child_number,&key_type,&net_type);
      get_extkey = (char *)((ulong)get_extkey & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&get_extkey,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x293,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      get_extkey = (char *)((ulong)get_extkey & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdExtKeyType,int>
                ((internal *)&gtest_ar,"kCfdExtPrivkey","key_type",(CfdExtKeyType *)&get_extkey,
                 &key_type);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x294,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      get_extkey = (char *)((ulong)get_extkey & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<CfdNetworkType,int>
                ((internal *)&gtest_ar,"kCfdNetworkMainnet","net_type",(CfdNetworkType *)&get_extkey
                 ,&net_type);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&get_extkey);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x295,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&get_extkey);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (get_extkey != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (get_extkey != (char *)0x0)) {
            (**(code **)(*(long *)get_extkey + 8))();
          }
          get_extkey = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      get_extkey = (char *)0x0;
      ret = CfdCreateExtkey(handle,0,0,(char *)0x0,fingerprint,privkey,chain_code,(uchar)depth,
                            child_number,&get_extkey);
      local_c0.data_ = (AssertHelperData *)((ulong)local_c0.data_._4_4_ << 0x20);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x29b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,"extprivkey3","get_extkey",extprivkey3,get_extkey);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                     ,0x29d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = (char *)0x0;
      }
      ret = CfdCreateExtkey(handle,0,1,(char *)0x0,fingerprint,pubkey,chain_code,(uchar)depth,
                            child_number,&get_extkey);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                   ,0x2a5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
          local_c0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (ret == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,
                   "\"xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE\""
                   ,"get_extkey",
                   "xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE"
                   ,get_extkey);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                     ,0x2a7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (local_c0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            local_c0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = (char *)0x0;
      }
      CfdFreeStringBuffer(version);
      CfdFreeStringBuffer(fingerprint);
      CfdFreeStringBuffer(chain_code);
    }
  }
  CfdFreeStringBuffer(extprivkey1);
  CfdFreeStringBuffer(extprivkey2);
  CfdFreeStringBuffer(extprivkey3);
  CfdFreeStringBuffer(extprivkey4);
  CfdFreeStringBuffer(key_path_data);
  CfdFreeStringBuffer(extpubkey1);
  CfdFreeStringBuffer(privkey);
  CfdFreeStringBuffer(wif);
  CfdFreeStringBuffer(pubkey);
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    version = (char *)0x0;
    ret = CfdGetLastErrorMessage(handle,&version);
    fingerprint = (char *)((ulong)fingerprint & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&fingerprint,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&fingerprint);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&chain_code,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x2c0,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&chain_code,(Message *)&fingerprint);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&chain_code);
      if (fingerprint != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (fingerprint != (char *)0x0)) {
          (**(code **)(*(long *)fingerprint + 8))();
        }
        fingerprint = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",version);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&fingerprint);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&chain_code,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x2c1,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&chain_code,(Message *)&fingerprint);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&chain_code);
      if (fingerprint != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (fingerprint != (char *)0x0)) {
          (**(code **)(*(long *)fingerprint + 8))();
        }
        fingerprint = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer(version);
  }
  ret = CfdFreeHandle(handle);
  version = (char *)((ulong)version & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&version,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&version);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fingerprint,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fingerprint,(Message *)&version);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fingerprint);
    if (version != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (version != (char *)0x0)) {
        (**(code **)(*(long *)version + 8))();
      }
      version = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_key, ExtkeyTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static constexpr const char* kSeed = "0e09fbdd00e575b654d480ae979f24da45ef4dee645c7dc2e3b30b2e093d38dda0202357754cc856f8920b8e31dd02e9d34f6a2b20dc825c6ba90f90009085e1";
  static constexpr const int kNetwork = kCfdNetworkMainnet;

  char* pubkey = nullptr;
  char* privkey = nullptr;
  char* wif = nullptr;
  char* extprivkey1 = nullptr;
  char* extprivkey2 = nullptr;
  char* extprivkey3 = nullptr;
  char* extprivkey4 = nullptr;
  char* extpubkey1 = nullptr;
  char* key_path_data = nullptr;
  ret = CfdCreateExtkeyFromSeed(
      handle, kSeed, kNetwork, kCfdExtPrivkey, &extprivkey1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprv9s21ZrQH143K38XAstQ4D3hCGbgydJgNff6CcwmkrWTBxksb2G4CsqAywJCKbTdywfCpmpJyxqf77iKK1ju1J982iP2PriifaNZLMbyPQCx", extprivkey1);

    ret = CfdCreateExtkeyFromParent(handle, extprivkey1, 44, true,
        kNetwork, kCfdExtPrivkey, &extprivkey2);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprv9tviYANkXM1CY831VtMFKFn6LP6aMHf1kvtCZyTL9YbyMwTR2BSmJaEoqw59BZdQhLSx9ZxyKsRUeCetxA2xZ34eupBqZUsifnWyLJJ16j3", extprivkey2);

    ret = CfdCreateExtPubkey(handle, extprivkey2, kNetwork,
        &extpubkey1);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2", extpubkey1);

    ret = CfdCreateExtkeyFromParentPath(handle, extprivkey2, "0h/0h/2",
        kNetwork, kCfdExtPrivkey, &extprivkey3);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("xprvA1YYKkMiZaDHRY4dmXjcP3js7ATJQAwt9gozTvi69etziyBAAENQN4w7sS3uBaF7rgXvP3sUtKFju7p3PosjNkRDuqqSFfxTjjEhgx6ejVZ", extprivkey3);

    ret = CfdGetPrivkeyFromExtkey(handle, extprivkey3,
        kNetwork, &privkey, &wif);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("597da1afc4218445ba9428c1c790a30fd21d5c4a932fa580b99dda7ec0887472", privkey);
    EXPECT_STREQ("KzDfmSzt1XqZh5m4sQPBqhpiTGncQ2xvXuWnKGMqR9gVHGSbVJP2", wif);

    ret = CfdGetPubkeyFromExtkey(handle, extprivkey3,
        kNetwork, &pubkey);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("031d7463018f867de51a27db866f869ceaf52abab71827a6051bab8a0fd020f4c1", pubkey);

    ret = CfdGetParentExtkeyPathData(
        handle, extprivkey2, "0h/0h/2", kCfdExtPrivkey, &key_path_data, &extprivkey4);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("[03af54a0/0h/0h/2]", key_path_data);
    EXPECT_STREQ(extprivkey3, extprivkey4);

    char* version = nullptr;
    char* fingerprint = nullptr;
    char* chain_code = nullptr;
    uint32_t depth = 0;
    uint32_t child_number = 0;
    ret = CfdGetExtkeyInformation(handle, extprivkey3, &version,
        &fingerprint, &chain_code, &depth, &child_number);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0488ade4", version);
      EXPECT_STREQ("8806118d", fingerprint);
      EXPECT_STREQ("a3d58c40ac9c588529edb6cf9576241a6c2c919843bd97c3c26b35538d91a292", chain_code);
      EXPECT_EQ(4, depth);
      EXPECT_EQ(2, child_number);

      int net_type = 0;
      int key_type = 0;
      ret = CfdGetExtkeyInfo(handle, extprivkey3, nullptr, nullptr, nullptr,
          &depth, &child_number, &key_type, &net_type);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(kCfdExtPrivkey, key_type);
      EXPECT_EQ(kCfdNetworkMainnet, net_type);

      char* get_extkey = nullptr;
      ret = CfdCreateExtkey(handle, kNetwork, kCfdExtPrivkey, nullptr,
          fingerprint, privkey, chain_code,
          static_cast<unsigned char>(depth), child_number, &get_extkey);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ(extprivkey3, get_extkey);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = nullptr;
      }

      ret = CfdCreateExtkey(handle, kNetwork, kCfdExtPubkey, nullptr,
          fingerprint, pubkey, chain_code,
          static_cast<unsigned char>(depth), child_number, &get_extkey);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("xpub6EXtjFtcPwmae296sZGckBgbfCHnodfjWujbGK7hhzRybmWJhmgeusFbiiZyG1iSeiBcQ7diPeUC9vtP9wLS44bWpqH4kuQQD5N4gA3LaFE", get_extkey);
        CfdFreeStringBuffer(get_extkey);
        get_extkey = nullptr;
      }

      CfdFreeStringBuffer(version);
      CfdFreeStringBuffer(fingerprint);
      CfdFreeStringBuffer(chain_code);
    }
  }

  CfdFreeStringBuffer(extprivkey1);
  CfdFreeStringBuffer(extprivkey2);
  CfdFreeStringBuffer(extprivkey3);
  CfdFreeStringBuffer(extprivkey4);
  CfdFreeStringBuffer(key_path_data);
  CfdFreeStringBuffer(extpubkey1);
  CfdFreeStringBuffer(privkey);
  CfdFreeStringBuffer(wif);
  CfdFreeStringBuffer(pubkey);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}